

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  size_t *psVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  huff_entropy_ptr_conflict entropy;
  jpeg_destination_mgr *pjVar5;
  int *piVar6;
  JBLOCKROW paJVar7;
  j_compress_ptr pjVar8;
  jpeg_error_mgr *pjVar9;
  JOCTET *pJVar10;
  bool bVar11;
  int iVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  
  entropy = (huff_entropy_ptr_conflict)cinfo->entropy;
  pjVar5 = cinfo->dest;
  entropy->next_output_byte = pjVar5->next_output_byte;
  entropy->free_in_buffer = pjVar5->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  iVar3 = cinfo->Se;
  lVar19 = (long)cinfo->Ss;
  if (cinfo->Ss <= iVar3) {
    iVar4 = cinfo->Al;
    piVar6 = cinfo->natural_order;
    paJVar7 = *MCU_data;
    iVar12 = 0;
    do {
      sVar2 = (*paJVar7)[piVar6[lVar19]];
      if (sVar2 == 0) {
LAB_00116abd:
        iVar12 = iVar12 + 1;
      }
      else {
        bVar13 = (byte)iVar4;
        uVar15 = (uint)-(int)sVar2 >> (bVar13 & 0x1f);
        uVar16 = (uint)(int)sVar2 >> (bVar13 & 0x1f);
        uVar14 = uVar16;
        if (sVar2 < 0) {
          uVar16 = uVar15;
          uVar14 = ~uVar15;
        }
        if (uVar16 == 0) goto LAB_00116abd;
        if (entropy->EOBRUN != 0) {
          emit_eobrun(entropy);
        }
        iVar21 = iVar12;
        if (0xf < iVar12) {
          do {
            if (entropy->gather_statistics == 0) {
              uVar15 = entropy->ac_derived_tbls[entropy->ac_tbl_no]->ehufco[0xf0];
              bVar13 = entropy->ac_derived_tbls[entropy->ac_tbl_no]->ehufsi[0xf0];
              iVar12 = (entropy->saved).put_bits;
              if (bVar13 == 0) {
                pjVar8 = entropy->cinfo;
                pjVar9 = pjVar8->err;
                pjVar9->msg_code = 0x29;
                (*pjVar9->error_exit)((j_common_ptr)pjVar8);
                if (entropy->gather_statistics != 0) goto LAB_001169af;
              }
              iVar12 = iVar12 + (char)bVar13;
              uVar20 = (ulong)(uVar15 & ~(uint)(-1L << (bVar13 & 0x3f))) <<
                       (0x18U - (char)iVar12 & 0x3f) | (entropy->saved).put_buffer;
              iVar18 = iVar12;
              if (7 < iVar12) {
                do {
                  pJVar10 = entropy->next_output_byte;
                  entropy->next_output_byte = pJVar10 + 1;
                  *pJVar10 = (JOCTET)(uVar20 >> 0x10);
                  psVar1 = &entropy->free_in_buffer;
                  *psVar1 = *psVar1 - 1;
                  if (*psVar1 == 0) {
                    dump_buffer_e(entropy);
                  }
                  if ((~(uint)uVar20 & 0xff0000) == 0) {
                    pJVar10 = entropy->next_output_byte;
                    entropy->next_output_byte = pJVar10 + 1;
                    *pJVar10 = '\0';
                    psVar1 = &entropy->free_in_buffer;
                    *psVar1 = *psVar1 - 1;
                    if (*psVar1 == 0) {
                      dump_buffer_e(entropy);
                    }
                  }
                  uVar20 = uVar20 << 8;
                  iVar12 = iVar18 + -8;
                  bVar11 = 0xf < iVar18;
                  iVar18 = iVar12;
                } while (bVar11);
              }
              (entropy->saved).put_buffer = uVar20;
              (entropy->saved).put_bits = iVar12;
            }
            else {
              entropy->ac_count_ptrs[entropy->ac_tbl_no][0xf0] =
                   entropy->ac_count_ptrs[entropy->ac_tbl_no][0xf0] + 1;
            }
LAB_001169af:
            iVar12 = iVar21 + -0x10;
            bVar11 = 0x1f < iVar21;
            iVar21 = iVar12;
          } while (bVar11);
        }
        iVar21 = 1;
        if (uVar16 != 1) {
          uVar20 = (ulong)uVar16;
          uVar16 = 0;
          do {
            uVar15 = uVar16;
            uVar16 = uVar15 + 1;
            uVar17 = (uint)uVar20;
            uVar20 = uVar20 >> 1;
          } while (3 < uVar17);
          iVar21 = uVar15 + 2;
          if (9 < uVar16) {
            pjVar9 = cinfo->err;
            pjVar9->msg_code = 6;
            (*pjVar9->error_exit)((j_common_ptr)cinfo);
          }
        }
        emit_ac_symbol(entropy,entropy->ac_tbl_no,iVar12 * 0x10 + iVar21);
        iVar12 = 0;
        if (entropy->gather_statistics == 0) {
          iVar18 = iVar21 + (entropy->saved).put_bits;
          uVar20 = (ulong)(~(uint)(-1L << ((byte)iVar21 & 0x3f)) & uVar14) <<
                   (0x18U - (char)iVar18 & 0x3f) | (entropy->saved).put_buffer;
          iVar21 = iVar18;
          if (7 < iVar18) {
            do {
              pJVar10 = entropy->next_output_byte;
              entropy->next_output_byte = pJVar10 + 1;
              *pJVar10 = (JOCTET)(uVar20 >> 0x10);
              psVar1 = &entropy->free_in_buffer;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) {
                dump_buffer_e(entropy);
              }
              if ((~(uint)uVar20 & 0xff0000) == 0) {
                pJVar10 = entropy->next_output_byte;
                entropy->next_output_byte = pJVar10 + 1;
                *pJVar10 = '\0';
                psVar1 = &entropy->free_in_buffer;
                *psVar1 = *psVar1 - 1;
                if (*psVar1 == 0) {
                  dump_buffer_e(entropy);
                }
              }
              uVar20 = uVar20 << 8;
              iVar18 = iVar21 + -8;
              bVar11 = 0xf < iVar21;
              iVar21 = iVar18;
            } while (bVar11);
          }
          (entropy->saved).put_buffer = uVar20;
          (entropy->saved).put_bits = iVar18;
        }
      }
      lVar19 = lVar19 + 1;
    } while (iVar3 + 1 != (int)lVar19);
    if ((0 < iVar12) && (uVar16 = entropy->EOBRUN + 1, entropy->EOBRUN = uVar16, uVar16 == 0x7fff))
    {
      emit_eobrun(entropy);
    }
  }
  pjVar5 = cinfo->dest;
  pjVar5->next_output_byte = entropy->next_output_byte;
  pjVar5->free_in_buffer = entropy->free_in_buffer;
  uVar16 = cinfo->restart_interval;
  if (uVar16 != 0) {
    uVar14 = entropy->restarts_to_go;
    if (entropy->restarts_to_go == 0) {
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
      uVar14 = uVar16;
    }
    entropy->restarts_to_go = uVar14 - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke;
  int v, v2, m;
  const int * natural_order;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Figure F.5: Encode_AC_Coefficients */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 0);		/* EOB decision */
    for (;;) {
      if ((v = (*block)[natural_order[k]]) >= 0) {
	if (v >>= cinfo->Al) {
	  arith_encode(cinfo, st + 1, 1);
	  arith_encode(cinfo, entropy->fixed_bin, 0);
	  break;
	}
      } else {
	v = -v;
	if (v >>= cinfo->Al) {
	  arith_encode(cinfo, st + 1, 1);
	  arith_encode(cinfo, entropy->fixed_bin, 1);
	  break;
	}
      }
      arith_encode(cinfo, st + 1, 0); st += 3; k++;
    }
    st += 2;
    /* Figure F.8: Encoding the magnitude category of v */
    m = 0;
    if (v -= 1) {
      arith_encode(cinfo, st, 1);
      m = 1;
      v2 = v;
      if (v2 >>= 1) {
	arith_encode(cinfo, st, 1);
	m <<= 1;
	st = entropy->ac_stats[tbl] +
	     (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	while (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st += 1;
	}
      }
    }
    arith_encode(cinfo, st, 0);
    /* Figure F.9: Encoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      arith_encode(cinfo, st, (m & v) ? 1 : 0);
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}